

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjSaveImage(char *filename,uchar *buffer,int width,int pitch,int height,int pixelFormat,
               int flags)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  tjhandle handle;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  djpeg_dest_ptr pdVar6;
  uint uVar7;
  j_decompress_ptr cinfo;
  uint uVar8;
  
  if ((0xb < (uint)pixelFormat || height < 1) ||
      ((pitch < 0 || width < 1) || (buffer == (uchar *)0x0 || filename == (char *)0x0))) {
    pcVar3 = (char *)__tls_get_addr(&PTR_00199f20);
    builtin_strncpy(pcVar3,"tjSaveImage(): Invalid argument",0x20);
    return -1;
  }
  handle = tjInitDecompress();
  if (handle == (tjhandle)0x0) {
    return -1;
  }
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    pcVar3 = (char *)__tls_get_addr(&PTR_00199f20);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    snprintf(pcVar3,200,"%s\n%s","tjSaveImage(): Cannot open output file",pcVar5);
    goto LAB_00137bf9;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
  if (iVar1 != 0) {
    iVar1 = -1;
    goto LAB_00137dc0;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  *(J_COLOR_SPACE *)((long)handle + 0x248) = pf2cs[(uint)pixelFormat];
  *(int *)((long)handle + 0x238) = width;
  *(int *)((long)handle + 0x23c) = height;
  *(undefined4 *)((long)handle + 0x22c) = 0xca;
  *(undefined8 *)((long)handle + 0x24c) = 0x100000001;
  pcVar3 = strrchr(filename,0x2e);
  if ((pcVar3 == (char *)0x0) || (iVar1 = strcasecmp(pcVar3,".bmp"), iVar1 != 0)) {
    pdVar6 = jinit_write_ppm(cinfo);
    if (pdVar6 == (djpeg_dest_ptr)0x0) {
      pcVar3 = (char *)__tls_get_addr(&PTR_00199f20);
      builtin_strncpy(pcVar3,"tjSaveImage(): Could not initialize PPM writer",0x2f);
      goto LAB_00137bf9;
    }
    uVar8 = (uint)flags >> 1 & 1;
  }
  else {
    pdVar6 = jinit_write_bmp(cinfo,0,0);
    if (pdVar6 == (djpeg_dest_ptr)0x0) {
      pcVar3 = (char *)__tls_get_addr(&PTR_00199f20);
      builtin_strncpy(pcVar3,"tjSaveImage(): Could not initialize bitmap writer",0x32);
LAB_00137bf9:
      iVar1 = -1;
      goto LAB_00137dc0;
    }
    uVar8 = (uint)((flags & 2U) == 0);
  }
  pdVar6->output_file = (FILE *)__stream;
  (*pdVar6->start_output)(cinfo,pdVar6);
  (**(code **)(*(long *)((long)handle + 0x210) + 0x30))(cinfo);
  if (pitch == 0) {
    pitch = tjPixelSize[(uint)pixelFormat] * width;
  }
  uVar2 = *(uint *)((long)handle + 0x2b0);
  while (uVar2 < *(uint *)((long)handle + 0x294)) {
    uVar7 = ~uVar2 + height;
    if (uVar8 == 0) {
      uVar7 = uVar2;
    }
    memcpy(*pdVar6->buffer,buffer + uVar7 * pitch,(long)tjPixelSize[(uint)pixelFormat] * (long)width
          );
    (*pdVar6->put_pixel_rows)(cinfo,pdVar6,1);
    uVar2 = *(int *)((long)handle + 0x2b0) + 1;
    *(uint *)((long)handle + 0x2b0) = uVar2;
  }
  (*pdVar6->finish_output)(cinfo,pdVar6);
  iVar1 = 0;
LAB_00137dc0:
  tjDestroy(handle);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    return iVar1;
  }
  return iVar1;
}

Assistant:

DLLEXPORT int tjSaveImage(const char *filename, unsigned char *buffer,
                          int width, int pitch, int height, int pixelFormat,
                          int flags)
{
  int retval = 0;
  tjhandle handle = NULL;
  tjinstance *this;
  j_decompress_ptr dinfo = NULL;
  djpeg_dest_ptr dst;
  FILE *file = NULL;
  char *ptr = NULL;
  boolean invert;

  if (!filename || !buffer || width < 1 || pitch < 0 || height < 1 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROWG("tjSaveImage(): Invalid argument");

  if ((handle = tjInitDecompress()) == NULL)
    return -1;
  this = (tjinstance *)handle;
  dinfo = &this->dinfo;

  if ((file = fopen(filename, "wb")) == NULL)
    THROW_UNIX("tjSaveImage(): Cannot open output file");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  dinfo->image_width = width;  dinfo->image_height = height;
  dinfo->global_state = DSTATE_READY;
  dinfo->scale_num = dinfo->scale_denom = 1;

  ptr = strrchr(filename, '.');
  if (ptr && !strcasecmp(ptr, ".bmp")) {
    if ((dst = jinit_write_bmp(dinfo, FALSE, FALSE)) == NULL)
      THROWG("tjSaveImage(): Could not initialize bitmap writer");
    invert = (flags & TJFLAG_BOTTOMUP) == 0;
  } else {
    if ((dst = jinit_write_ppm(dinfo)) == NULL)
      THROWG("tjSaveImage(): Could not initialize PPM writer");
    invert = (flags & TJFLAG_BOTTOMUP) != 0;
  }

  dst->output_file = file;
  (*dst->start_output) (dinfo, dst);
  (*dinfo->mem->realize_virt_arrays) ((j_common_ptr)dinfo);

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  while (dinfo->output_scanline < dinfo->output_height) {
    unsigned char *rowptr;

    if (invert)
      rowptr = &buffer[(height - dinfo->output_scanline - 1) * pitch];
    else
      rowptr = &buffer[dinfo->output_scanline * pitch];
    memcpy(dst->buffer[0], rowptr, width * tjPixelSize[pixelFormat]);
    (*dst->put_pixel_rows) (dinfo, dst, 1);
    dinfo->output_scanline++;
  }

  (*dst->finish_output) (dinfo, dst);

bailout:
  if (handle) tjDestroy(handle);
  if (file) fclose(file);
  return retval;
}